

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O3

bool __thiscall
CLI::App::_parse_subcommand
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer *pppAVar1;
  pointer pbVar2;
  pointer pcVar3;
  iterator iVar4;
  size_t sVar5;
  App *pAVar6;
  HorribleError *this_00;
  long *plVar7;
  size_type *psVar8;
  bool bVar9;
  App *com;
  App *local_70;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  sVar5 = _count_remaining_positionals(this,true);
  if (sVar5 == 0) {
    pAVar6 = _find_subcommand(this,(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish + -1,true,true);
    bVar9 = pAVar6 != (App *)0x0;
    local_70 = pAVar6;
    if (pAVar6 == (App *)0x0) {
      if (this->parent_ == (App *)0x0) {
        this_00 = (HorribleError *)__cxa_allocate_exception(0x38);
        ::std::operator+(&local_48,"Subcommand ",
                         (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish + -1);
        plVar7 = (long *)::std::__cxx11::string::append((char *)&local_48);
        local_68._M_dataplus._M_p = (pointer)*plVar7;
        psVar8 = (size_type *)(plVar7 + 2);
        if ((size_type *)local_68._M_dataplus._M_p == psVar8) {
          local_68.field_2._M_allocated_capacity = *psVar8;
          local_68.field_2._8_8_ = plVar7[3];
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        }
        else {
          local_68.field_2._M_allocated_capacity = *psVar8;
        }
        local_68._M_string_length = plVar7[1];
        *plVar7 = (long)psVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        HorribleError::HorribleError(this_00,&local_68);
        __cxa_throw(this_00,&HorribleError::typeinfo,Error::~Error);
      }
    }
    else {
      pbVar2 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = pbVar2 + -1;
      pcVar3 = pbVar2[-1]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != &pbVar2[-1].field_2) {
        operator_delete(pcVar3);
      }
      iVar4._M_current =
           (this->parsed_subcommands_).super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->parsed_subcommands_).super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<CLI::App*,std::allocator<CLI::App*>>::_M_realloc_insert<CLI::App*const&>
                  ((vector<CLI::App*,std::allocator<CLI::App*>> *)&this->parsed_subcommands_,iVar4,
                   &local_70);
        pAVar6 = local_70;
      }
      else {
        *iVar4._M_current = pAVar6;
        pppAVar1 = &(this->parsed_subcommands_).
                    super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppAVar1 = *pppAVar1 + 1;
      }
      _parse(pAVar6,args);
      pAVar6 = local_70->parent_;
      if (pAVar6 != this) {
        do {
          _trigger_pre_parse(pAVar6,(long)(args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start >> 5);
          iVar4._M_current =
               (pAVar6->parsed_subcommands_).
               super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (pAVar6->parsed_subcommands_).
              super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<CLI::App*,std::allocator<CLI::App*>>::_M_realloc_insert<CLI::App*const&>
                      ((vector<CLI::App*,std::allocator<CLI::App*>> *)&pAVar6->parsed_subcommands_,
                       iVar4,&local_70);
          }
          else {
            *iVar4._M_current = local_70;
            pppAVar1 = &(pAVar6->parsed_subcommands_).
                        super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppAVar1 = *pppAVar1 + 1;
          }
          pAVar6 = pAVar6->parent_;
        } while (pAVar6 != this);
      }
    }
  }
  else {
    _parse_positional(this,args,false);
    bVar9 = true;
  }
  return bVar9;
}

Assistant:

bool _parse_subcommand(std::vector<std::string> &args) {
        if(_count_remaining_positionals(/* required */ true) > 0) {
            _parse_positional(args, false);
            return true;
        }
        auto com = _find_subcommand(args.back(), true, true);
        if(com != nullptr) {
            args.pop_back();
            parsed_subcommands_.push_back(com);
            com->_parse(args);
            auto parent_app = com->parent_;
            while(parent_app != this) {
                parent_app->_trigger_pre_parse(args.size());
                parent_app->parsed_subcommands_.push_back(com);
                parent_app = parent_app->parent_;
            }
            return true;
        }

        if(parent_ == nullptr)
            throw HorribleError("Subcommand " + args.back() + " missing");
        return false;
    }